

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O3

void __thiscall Imf_3_2::SampleCountChannel::~SampleCountChannel(SampleCountChannel *this)

{
  (this->super_ImageChannel)._vptr_ImageChannel = (_func_int **)&PTR_pixelType_00128c58;
  if (this->_numSamples != (uint *)0x0) {
    operator_delete__(this->_numSamples);
  }
  if (this->_sampleListSizes != (uint *)0x0) {
    operator_delete__(this->_sampleListSizes);
  }
  if (this->_sampleListPositions != (size_t *)0x0) {
    operator_delete__(this->_sampleListPositions);
  }
  ImageChannel::~ImageChannel(&this->super_ImageChannel);
  return;
}

Assistant:

SampleCountChannel::~SampleCountChannel ()
{
    delete[] _numSamples;
    delete[] _sampleListSizes;
    delete[] _sampleListPositions;
}